

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t2.c
# Opt level: O2

OPJ_BOOL opj_t2_read_packet_header
                   (opj_t2_t *p_t2,opj_tcd_tile_t *p_tile,opj_tcp_t *p_tcp,opj_pi_iterator_t *p_pi,
                   OPJ_BOOL *p_is_data_present,OPJ_BYTE *p_src_data,OPJ_UINT32 *p_data_read,
                   OPJ_UINT32 p_max_length,opj_packet_info_t *p_pack_info,opj_event_mgr_t *p_manager
                   )

{
  opj_cp_t *poVar1;
  opj_tcd_seg_t *poVar2;
  OPJ_BYTE *pOVar3;
  OPJ_UINT32 OVar4;
  OPJ_BOOL OVar5;
  OPJ_UINT32 OVar6;
  OPJ_UINT32 OVar7;
  uint uVar8;
  OPJ_UINT32 *pOVar9;
  opj_bio_t *bio;
  ptrdiff_t pVar10;
  uint uVar11;
  uint n;
  char *pcVar12;
  opj_tcd_band_t *poVar13;
  OPJ_UINT32 i;
  int iVar14;
  opj_tcd_precinct_t *poVar15;
  ulong uVar16;
  opj_tcd_cblk_dec_t *cblk;
  OPJ_BYTE *pOVar17;
  opj_tcd_resolution_t *poVar18;
  bool bVar19;
  OPJ_BYTE **local_90;
  OPJ_BYTE *l_current_data;
  opj_tcd_resolution_t *local_70;
  OPJ_UINT32 local_68;
  uint local_64;
  opj_tcd_precinct_t *local_60;
  OPJ_BOOL *local_58;
  opj_tcd_band_t *local_50;
  OPJ_BYTE *local_48;
  OPJ_BYTE *local_40;
  OPJ_UINT32 l_remaining_length;
  
  poVar1 = p_t2->cp;
  poVar18 = p_tile->comps[p_pi->compno].resolutions + p_pi->resno;
  l_current_data = p_src_data;
  local_70 = poVar18;
  local_58 = p_is_data_present;
  if (p_pi->layno == 0) {
    poVar13 = poVar18->bands;
    for (uVar11 = 0; uVar11 < poVar18->numbands; uVar11 = uVar11 + 1) {
      OVar5 = opj_tcd_is_band_empty(poVar13);
      if (OVar5 == 0) {
        uVar8 = p_pi->precno;
        if (poVar13->precincts_data_size / 0x38 <= uVar8) {
          opj_event_msg((opj_event_mgr_t *)p_pack_info,1,"Invalid precinct\n");
          return 0;
        }
        poVar15 = poVar13->precincts;
        opj_tgt_reset(poVar15[uVar8].incltree);
        opj_tgt_reset(poVar15[uVar8].imsbtree);
        iVar14 = poVar15[uVar8].ch * poVar15[uVar8].cw;
        pOVar9 = &(poVar15[uVar8].cblks.enc)->data_size;
        while (bVar19 = iVar14 != 0, iVar14 = iVar14 + -1, poVar18 = local_70, bVar19) {
          *(undefined8 *)(pOVar9 + -1) = 0;
          pOVar9 = pOVar9 + 0x12;
        }
      }
      poVar13 = poVar13 + 1;
    }
  }
  pOVar17 = p_src_data;
  if ((p_tcp->csty & 2) != 0) {
    if (p_max_length < 6) {
      pcVar12 = "Not enough space for expected SOP marker\n";
    }
    else {
      if ((*p_src_data == 0xff) && (p_src_data[1] == 0x91)) {
        pOVar17 = p_src_data + 6;
        l_current_data = pOVar17;
        goto LAB_001325f7;
      }
      pcVar12 = "Expected SOP marker\n";
    }
    opj_event_msg((opj_event_mgr_t *)p_pack_info,2,pcVar12);
  }
LAB_001325f7:
  bio = opj_bio_create();
  if (bio == (opj_bio_t *)0x0) {
LAB_00132941:
    OVar5 = 0;
  }
  else {
    if ((poVar1->field_0x90 & 1) == 0) {
      if ((p_tcp->field_0x1638 & 2) == 0) {
        pOVar9 = &l_remaining_length;
        l_remaining_length = (p_max_length + (int)p_src_data) - (int)pOVar17;
        local_90 = &l_current_data;
      }
      else {
        local_90 = &p_tcp->ppt_data;
        pOVar17 = p_tcp->ppt_data;
        pOVar9 = &p_tcp->ppt_len;
      }
    }
    else {
      local_90 = &poVar1->ppm_data;
      pOVar17 = poVar1->ppm_data;
      pOVar9 = &poVar1->ppm_len;
    }
    opj_bio_init_dec(bio,pOVar17,*pOVar9);
    OVar4 = opj_bio_read(bio,1);
    if (OVar4 == 0) {
      opj_bio_inalign(bio);
      pVar10 = opj_bio_numbytes(bio);
      pOVar17 = pOVar17 + pVar10;
      opj_bio_destroy(bio);
      if ((p_tcp->csty & 4) != 0) {
        if ((*(int *)local_90 - (int)pOVar17) + *pOVar9 < 2) {
          pcVar12 = "Not enough space for expected EPH marker\n";
        }
        else {
          if ((*pOVar17 == 0xff) && (pOVar17[1] == 0x92)) {
            pOVar17 = pOVar17 + 2;
            goto LAB_00132a1b;
          }
          pcVar12 = "Expected EPH marker\n";
        }
        opj_event_msg((opj_event_mgr_t *)p_pack_info,2,pcVar12);
      }
LAB_00132a1b:
      pOVar3 = *local_90;
      uVar11 = (int)pOVar17 - (int)pOVar3;
      *pOVar9 = *pOVar9 - uVar11;
      *local_90 = pOVar3 + uVar11;
      *local_58 = 0;
    }
    else {
      poVar13 = local_70->bands;
      uVar11 = 0;
      local_48 = pOVar17;
      local_40 = p_src_data;
      while (p_src_data = local_40, pOVar17 = local_48, uVar11 < local_70->numbands) {
        poVar15 = poVar13->precincts;
        uVar8 = p_pi->precno;
        local_64 = uVar11;
        local_50 = poVar13;
        OVar5 = opj_tcd_is_band_empty(poVar13);
        if (OVar5 == 0) {
          local_60 = poVar15 + uVar8;
          local_68 = poVar15[uVar8].ch * poVar15[uVar8].cw;
          cblk = poVar15[uVar8].cblks.dec;
          for (OVar4 = 0; poVar15 = local_60, OVar4 != local_68; OVar4 = OVar4 + 1) {
            if (cblk->numsegs == 0) {
              OVar6 = opj_tgt_decode(bio,local_60->incltree,OVar4,p_pi->layno + 1);
            }
            else {
              OVar6 = opj_bio_read(bio,1);
              poVar15 = local_60;
            }
            OVar7 = 1;
            if (OVar6 == 0) {
              cblk->numnewpasses = 0;
            }
            else {
              if (cblk->numsegs == 0) {
                iVar14 = 0;
                do {
                  OVar6 = opj_tgt_decode(bio,poVar15->imsbtree,OVar4,iVar14);
                  iVar14 = iVar14 + 1;
                } while (OVar6 == 0);
                cblk->numbps = (local_50->numbps - iVar14) + 2;
                cblk->numlenbits = 3;
              }
              OVar6 = opj_bio_read(bio,1);
              if (OVar6 != 0) {
                OVar6 = opj_bio_read(bio,1);
                OVar7 = 2;
                if (OVar6 != 0) {
                  OVar7 = opj_bio_read(bio,2);
                  if (OVar7 == 3) {
                    OVar7 = opj_bio_read(bio,5);
                    if (OVar7 == 0x1f) {
                      OVar7 = opj_bio_read(bio,7);
                      OVar7 = OVar7 + 0x25;
                    }
                    else {
                      OVar7 = OVar7 + 6;
                    }
                  }
                  else {
                    OVar7 = OVar7 + 3;
                  }
                }
              }
              cblk->numnewpasses = OVar7;
              iVar14 = -1;
              do {
                OVar6 = opj_bio_read(bio,1);
                iVar14 = iVar14 + 1;
              } while (OVar6 != 0);
              cblk->numlenbits = cblk->numlenbits + iVar14;
              uVar11 = cblk->numsegs;
              if (uVar11 == 0) {
                uVar16 = 0;
                iVar14 = opj_t2_init_seg(cblk,0,p_tcp->tccps[p_pi->compno].cblksty,1);
LAB_001328a1:
                if (iVar14 == 0) goto LAB_00132939;
              }
              else {
                uVar16 = (ulong)(uVar11 - 1);
                if (cblk->segs[uVar16].numpasses == cblk->segs[uVar16].maxpasses) {
                  iVar14 = opj_t2_init_seg(cblk,uVar11,p_tcp->tccps[p_pi->compno].cblksty,0);
                  uVar16 = (ulong)uVar11;
                  goto LAB_001328a1;
                }
              }
              uVar11 = cblk->numnewpasses;
              while( true ) {
                poVar2 = cblk->segs;
                uVar8 = poVar2[uVar16].maxpasses - poVar2[uVar16].numpasses;
                if ((int)uVar11 <= (int)uVar8) {
                  uVar8 = uVar11;
                }
                poVar2[uVar16].numnewpasses = uVar8;
                n = cblk->numlenbits;
                for (; 1 < uVar8; uVar8 = uVar8 >> 1) {
                  n = n + 1;
                }
                if (0x20 < n) {
                  opj_event_msg((opj_event_mgr_t *)p_pack_info,1,
                                "Invalid bit number %d in opj_t2_read_packet_header()\n");
                  opj_bio_destroy(bio);
                  return 0;
                }
                OVar6 = opj_bio_read(bio,n);
                poVar2 = cblk->segs;
                poVar2[uVar16].newlen = OVar6;
                OVar6 = poVar2[uVar16].numnewpasses;
                uVar8 = uVar11 - OVar6;
                if (uVar8 == 0 || (int)uVar11 < (int)OVar6) break;
                uVar11 = (int)uVar16 + 1;
                uVar16 = (ulong)uVar11;
                OVar5 = opj_t2_init_seg(cblk,uVar11,p_tcp->tccps[p_pi->compno].cblksty,0);
                uVar11 = uVar8;
                if (OVar5 == 0) goto LAB_00132939;
              }
            }
            cblk = cblk + 1;
          }
        }
        poVar13 = local_50 + 1;
        uVar11 = local_64 + 1;
      }
      OVar5 = opj_bio_inalign(bio);
      if (OVar5 == 0) {
LAB_00132939:
        opj_bio_destroy(bio);
        goto LAB_00132941;
      }
      pVar10 = opj_bio_numbytes(bio);
      pOVar17 = pOVar17 + pVar10;
      opj_bio_destroy(bio);
      if ((p_tcp->csty & 4) != 0) {
        if ((*(int *)local_90 - (int)pOVar17) + *pOVar9 < 2) {
          pcVar12 = "Not enough space for expected EPH marker\n";
        }
        else {
          if ((*pOVar17 == 0xff) && (pOVar17[1] == 0x92)) {
            pOVar17 = pOVar17 + 2;
            goto LAB_00132ae6;
          }
          pcVar12 = "Expected EPH marker\n";
        }
        opj_event_msg((opj_event_mgr_t *)p_pack_info,2,pcVar12);
      }
LAB_00132ae6:
      pOVar3 = *local_90;
      uVar11 = (int)pOVar17 - (int)pOVar3;
      *pOVar9 = *pOVar9 - uVar11;
      *local_90 = pOVar3 + uVar11;
      *local_58 = 1;
    }
    *p_data_read = (int)l_current_data - (int)p_src_data;
    OVar5 = 1;
  }
  return OVar5;
}

Assistant:

static OPJ_BOOL opj_t2_read_packet_header(opj_t2_t* p_t2,
        opj_tcd_tile_t *p_tile,
        opj_tcp_t *p_tcp,
        opj_pi_iterator_t *p_pi,
        OPJ_BOOL * p_is_data_present,
        OPJ_BYTE *p_src_data,
        OPJ_UINT32 * p_data_read,
        OPJ_UINT32 p_max_length,
        opj_packet_info_t *p_pack_info,
        opj_event_mgr_t *p_manager)

{
    /* loop */
    OPJ_UINT32 bandno, cblkno;
    OPJ_UINT32 l_nb_code_blocks;
    OPJ_UINT32 l_remaining_length;
    OPJ_UINT32 l_header_length;
    OPJ_UINT32 * l_modified_length_ptr = 00;
    OPJ_BYTE *l_current_data = p_src_data;
    opj_cp_t *l_cp = p_t2->cp;
    opj_bio_t *l_bio = 00;  /* BIO component */
    opj_tcd_band_t *l_band = 00;
    opj_tcd_cblk_dec_t* l_cblk = 00;
    opj_tcd_resolution_t* l_res =
        &p_tile->comps[p_pi->compno].resolutions[p_pi->resno];

    OPJ_BYTE *l_header_data = 00;
    OPJ_BYTE **l_header_data_start = 00;

    OPJ_UINT32 l_present;

    if (p_pi->layno == 0) {
        l_band = l_res->bands;

        /* reset tagtrees */
        for (bandno = 0; bandno < l_res->numbands; ++bandno) {
            if (!opj_tcd_is_band_empty(l_band)) {
                opj_tcd_precinct_t *l_prc = &l_band->precincts[p_pi->precno];
                if (!(p_pi->precno < (l_band->precincts_data_size / sizeof(
                                          opj_tcd_precinct_t)))) {
                    opj_event_msg(p_manager, EVT_ERROR, "Invalid precinct\n");
                    return OPJ_FALSE;
                }


                opj_tgt_reset(l_prc->incltree);
                opj_tgt_reset(l_prc->imsbtree);
                l_cblk = l_prc->cblks.dec;

                l_nb_code_blocks = l_prc->cw * l_prc->ch;
                for (cblkno = 0; cblkno < l_nb_code_blocks; ++cblkno) {
                    l_cblk->numsegs = 0;
                    l_cblk->real_num_segs = 0;
                    ++l_cblk;
                }
            }

            ++l_band;
        }
    }

    /* SOP markers */

    if (p_tcp->csty & J2K_CP_CSTY_SOP) {
        if (p_max_length < 6) {
            opj_event_msg(p_manager, EVT_WARNING,
                          "Not enough space for expected SOP marker\n");
        } else if ((*l_current_data) != 0xff || (*(l_current_data + 1) != 0x91)) {
            opj_event_msg(p_manager, EVT_WARNING, "Expected SOP marker\n");
        } else {
            l_current_data += 6;
        }

        /** TODO : check the Nsop value */
    }

    /*
    When the marker PPT/PPM is used the packet header are store in PPT/PPM marker
    This part deal with this caracteristic
    step 1: Read packet header in the saved structure
    step 2: Return to codestream for decoding
    */

    l_bio = opj_bio_create();
    if (! l_bio) {
        return OPJ_FALSE;
    }

    if (l_cp->ppm == 1) { /* PPM */
        l_header_data_start = &l_cp->ppm_data;
        l_header_data = *l_header_data_start;
        l_modified_length_ptr = &(l_cp->ppm_len);

    } else if (p_tcp->ppt == 1) { /* PPT */
        l_header_data_start = &(p_tcp->ppt_data);
        l_header_data = *l_header_data_start;
        l_modified_length_ptr = &(p_tcp->ppt_len);
    } else { /* Normal Case */
        l_header_data_start = &(l_current_data);
        l_header_data = *l_header_data_start;
        l_remaining_length = (OPJ_UINT32)(p_src_data + p_max_length - l_header_data);
        l_modified_length_ptr = &(l_remaining_length);
    }

    opj_bio_init_dec(l_bio, l_header_data, *l_modified_length_ptr);

    l_present = opj_bio_read(l_bio, 1);
    JAS_FPRINTF(stderr, "present=%d \n", l_present);
    if (!l_present) {
        /* TODO MSD: no test to control the output of this function*/
        opj_bio_inalign(l_bio);
        l_header_data += opj_bio_numbytes(l_bio);
        opj_bio_destroy(l_bio);

        /* EPH markers */
        if (p_tcp->csty & J2K_CP_CSTY_EPH) {
            if ((*l_modified_length_ptr - (OPJ_UINT32)(l_header_data -
                    *l_header_data_start)) < 2U) {
                opj_event_msg(p_manager, EVT_WARNING,
                              "Not enough space for expected EPH marker\n");
            } else if ((*l_header_data) != 0xff || (*(l_header_data + 1) != 0x92)) {
                opj_event_msg(p_manager, EVT_WARNING, "Expected EPH marker\n");
            } else {
                l_header_data += 2;
            }
        }

        l_header_length = (OPJ_UINT32)(l_header_data - *l_header_data_start);
        *l_modified_length_ptr -= l_header_length;
        *l_header_data_start += l_header_length;

        /* << INDEX */
        /* End of packet header position. Currently only represents the distance to start of packet
           Will be updated later by incrementing with packet start value */
        if (p_pack_info) {
            p_pack_info->end_ph_pos = (OPJ_INT32)(l_current_data - p_src_data);
        }
        /* INDEX >> */

        * p_is_data_present = OPJ_FALSE;
        *p_data_read = (OPJ_UINT32)(l_current_data - p_src_data);
        return OPJ_TRUE;
    }

    l_band = l_res->bands;
    for (bandno = 0; bandno < l_res->numbands; ++bandno, ++l_band) {
        opj_tcd_precinct_t *l_prc = &(l_band->precincts[p_pi->precno]);

        if (opj_tcd_is_band_empty(l_band)) {
            continue;
        }

        l_nb_code_blocks = l_prc->cw * l_prc->ch;
        l_cblk = l_prc->cblks.dec;
        for (cblkno = 0; cblkno < l_nb_code_blocks; cblkno++) {
            OPJ_UINT32 l_included, l_increment, l_segno;
            OPJ_INT32 n;

            /* if cblk not yet included before --> inclusion tagtree */
            if (!l_cblk->numsegs) {
                l_included = opj_tgt_decode(l_bio, l_prc->incltree, cblkno,
                                            (OPJ_INT32)(p_pi->layno + 1));
                /* else one bit */
            } else {
                l_included = opj_bio_read(l_bio, 1);
            }

            /* if cblk not included */
            if (!l_included) {
                l_cblk->numnewpasses = 0;
                ++l_cblk;
                JAS_FPRINTF(stderr, "included=%d \n", l_included);
                continue;
            }

            /* if cblk not yet included --> zero-bitplane tagtree */
            if (!l_cblk->numsegs) {
                OPJ_UINT32 i = 0;

                while (!opj_tgt_decode(l_bio, l_prc->imsbtree, cblkno, (OPJ_INT32)i)) {
                    ++i;
                }

                l_cblk->numbps = (OPJ_UINT32)l_band->numbps + 1 - i;
                l_cblk->numlenbits = 3;
            }

            /* number of coding passes */
            l_cblk->numnewpasses = opj_t2_getnumpasses(l_bio);
            l_increment = opj_t2_getcommacode(l_bio);

            /* length indicator increment */
            l_cblk->numlenbits += l_increment;
            l_segno = 0;

            if (!l_cblk->numsegs) {
                if (! opj_t2_init_seg(l_cblk, l_segno, p_tcp->tccps[p_pi->compno].cblksty, 1)) {
                    opj_bio_destroy(l_bio);
                    return OPJ_FALSE;
                }
            } else {
                l_segno = l_cblk->numsegs - 1;
                if (l_cblk->segs[l_segno].numpasses == l_cblk->segs[l_segno].maxpasses) {
                    ++l_segno;
                    if (! opj_t2_init_seg(l_cblk, l_segno, p_tcp->tccps[p_pi->compno].cblksty, 0)) {
                        opj_bio_destroy(l_bio);
                        return OPJ_FALSE;
                    }
                }
            }
            n = (OPJ_INT32)l_cblk->numnewpasses;

            do {
                OPJ_UINT32 bit_number;
                l_cblk->segs[l_segno].numnewpasses = (OPJ_UINT32)opj_int_min((OPJ_INT32)(
                        l_cblk->segs[l_segno].maxpasses - l_cblk->segs[l_segno].numpasses), n);
                bit_number = l_cblk->numlenbits + opj_uint_floorlog2(
                                 l_cblk->segs[l_segno].numnewpasses);
                if (bit_number > 32) {
                    opj_event_msg(p_manager, EVT_ERROR,
                                  "Invalid bit number %d in opj_t2_read_packet_header()\n",
                                  bit_number);
                    opj_bio_destroy(l_bio);
                    return OPJ_FALSE;
                }
                l_cblk->segs[l_segno].newlen = opj_bio_read(l_bio, bit_number);
                JAS_FPRINTF(stderr, "included=%d numnewpasses=%d increment=%d len=%d \n",
                            l_included, l_cblk->segs[l_segno].numnewpasses, l_increment,
                            l_cblk->segs[l_segno].newlen);

                n -= (OPJ_INT32)l_cblk->segs[l_segno].numnewpasses;
                if (n > 0) {
                    ++l_segno;

                    if (! opj_t2_init_seg(l_cblk, l_segno, p_tcp->tccps[p_pi->compno].cblksty, 0)) {
                        opj_bio_destroy(l_bio);
                        return OPJ_FALSE;
                    }
                }
            } while (n > 0);

            ++l_cblk;
        }
    }

    if (!opj_bio_inalign(l_bio)) {
        opj_bio_destroy(l_bio);
        return OPJ_FALSE;
    }

    l_header_data += opj_bio_numbytes(l_bio);
    opj_bio_destroy(l_bio);

    /* EPH markers */
    if (p_tcp->csty & J2K_CP_CSTY_EPH) {
        if ((*l_modified_length_ptr - (OPJ_UINT32)(l_header_data -
                *l_header_data_start)) < 2U) {
            opj_event_msg(p_manager, EVT_WARNING,
                          "Not enough space for expected EPH marker\n");
        } else if ((*l_header_data) != 0xff || (*(l_header_data + 1) != 0x92)) {
            opj_event_msg(p_manager, EVT_WARNING, "Expected EPH marker\n");
        } else {
            l_header_data += 2;
        }
    }

    l_header_length = (OPJ_UINT32)(l_header_data - *l_header_data_start);
    JAS_FPRINTF(stderr, "hdrlen=%d \n", l_header_length);
    JAS_FPRINTF(stderr, "packet body\n");
    *l_modified_length_ptr -= l_header_length;
    *l_header_data_start += l_header_length;

    /* << INDEX */
    /* End of packet header position. Currently only represents the distance to start of packet
     Will be updated later by incrementing with packet start value */
    if (p_pack_info) {
        p_pack_info->end_ph_pos = (OPJ_INT32)(l_current_data - p_src_data);
    }
    /* INDEX >> */

    *p_is_data_present = OPJ_TRUE;
    *p_data_read = (OPJ_UINT32)(l_current_data - p_src_data);

    return OPJ_TRUE;
}